

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O1

void __thiscall rw::Frame::updateObjects(Frame *this)

{
  LLLink *pLVar1;
  uint8 *puVar2;
  byte bVar3;
  Frame *pFVar4;
  long lVar5;
  
  lVar5 = engine;
  pFVar4 = this->root;
  bVar3 = (pFVar4->object).privateFlags;
  if ((bVar3 & 3) == 0) {
    pLVar1 = (LLLink *)(engine + 0x10);
    (pFVar4->inDirtyList).next = *(LLLink **)(engine + 0x10);
    (pFVar4->inDirtyList).prev = pLVar1;
    *(LLLink **)(*(long *)(lVar5 + 0x10) + 8) = &pFVar4->inDirtyList;
    *(LLLink **)(lVar5 + 0x10) = &pFVar4->inDirtyList;
  }
  (pFVar4->object).privateFlags = bVar3 | 3;
  puVar2 = &(this->object).privateFlags;
  *puVar2 = *puVar2 | 0xc;
  return;
}

Assistant:

void
Frame::updateObjects(void)
{
	// Mark root as dirty and insert into dirty list if necessary
	if((this->root->object.privateFlags & HIERARCHYSYNC) == 0)
		engine->frameDirtyList.add(&this->root->inDirtyList);
	this->root->object.privateFlags |= HIERARCHYSYNC;
	// Mark subtree as dirty as well
	this->object.privateFlags |= SUBTREESYNC;
}